

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3ExprListCompare(ExprList *pA,ExprList *pB,int iTab)

{
  int iVar1;
  long lVar2;
  long lVar3;
  
  iVar1 = 0;
  if (pA != (ExprList *)0x0 || pB != (ExprList *)0x0) {
    if ((pA == (ExprList *)0x0 || pB == (ExprList *)0x0) || (pA->nExpr != pB->nExpr)) {
LAB_001570cf:
      iVar1 = 1;
    }
    else if (0 < pA->nExpr) {
      lVar2 = 0x20;
      lVar3 = 0;
      do {
        if ((*(char *)((long)pA->a + lVar2 + -8) != *(char *)((long)pB->a + lVar2 + -8)) ||
           (iVar1 = sqlite3ExprCompare((Parse *)0x0,*(Expr **)((long)(pA->a + -1) + lVar2),
                                       *(Expr **)((long)(pB->a + -1) + lVar2),iTab), iVar1 != 0))
        goto LAB_001570cf;
        lVar3 = lVar3 + 1;
        lVar2 = lVar2 + 0x20;
        iVar1 = 0;
      } while (lVar3 < pA->nExpr);
    }
  }
  return iVar1;
}

Assistant:

SQLITE_PRIVATE int sqlite3ExprListCompare(ExprList *pA, ExprList *pB, int iTab){
  int i;
  if( pA==0 && pB==0 ) return 0;
  if( pA==0 || pB==0 ) return 1;
  if( pA->nExpr!=pB->nExpr ) return 1;
  for(i=0; i<pA->nExpr; i++){
    Expr *pExprA = pA->a[i].pExpr;
    Expr *pExprB = pB->a[i].pExpr;
    if( pA->a[i].sortOrder!=pB->a[i].sortOrder ) return 1;
    if( sqlite3ExprCompare(0, pExprA, pExprB, iTab) ) return 1;
  }
  return 0;
}